

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int new_localvar(LexState *ls,TString *name)

{
  int iVar1;
  FuncState *fs;
  lua_State *L;
  Dyndata *pDVar2;
  Vardesc *pVVar3;
  long lVar4;
  
  fs = ls->fs;
  L = ls->L;
  pDVar2 = ls->dyd;
  checklimit(fs,((pDVar2->actvar).n - fs->firstlocal) + 1,200,"local variables");
  pVVar3 = (Vardesc *)
           luaM_growaux_(L,(pDVar2->actvar).arr,(pDVar2->actvar).n + 1,&(pDVar2->actvar).size,0x18,
                         0x7fff,"local variables");
  (pDVar2->actvar).arr = pVVar3;
  iVar1 = (pDVar2->actvar).n;
  (pDVar2->actvar).n = iVar1 + 1;
  lVar4 = (long)iVar1 * 0x18;
  *(undefined1 *)((long)pVVar3 + lVar4 + 9) = 0;
  *(TString **)((long)pVVar3 + lVar4 + 0x10) = name;
  return ~fs->firstlocal + (pDVar2->actvar).n;
}

Assistant:

static int new_localvar (LexState *ls, TString *name) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  Vardesc *var;
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                 MAXVARS, "local variables");
  luaM_growvector(L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, SHRT_MAX, "local variables");
  var = &dyd->actvar.arr[dyd->actvar.n++];
  var->vd.kind = VDKREG;  /* default */
  var->vd.name = name;
  return dyd->actvar.n - 1 - fs->firstlocal;
}